

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

void __thiscall ON_BrepLoop::ON_BrepLoop(ON_BrepLoop *this)

{
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081b908;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_reserved1 = 0;
  this->m_loop_index = -1;
  (this->m_ti)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  (this->m_ti).m_a = (int *)0x0;
  (this->m_ti).m_count = 0;
  (this->m_ti).m_capacity = 0;
  this->m_type = unknown;
  this->m_fi = -1;
  ON_BoundingBox::ON_BoundingBox(&this->m_pbox);
  this->m_brep = (ON_Brep *)0x0;
  (this->m_loop_user).h = 0;
  return;
}

Assistant:

ON_BrepLoop::ON_BrepLoop()
{
  memset(&m_loop_user,0,sizeof(m_loop_user));
}